

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::icu_calendar_facet::~icu_calendar_facet(icu_calendar_facet *this)

{
  ~icu_calendar_facet(this);
  operator_delete(this);
  return;
}

Assistant:

icu_calendar_facet(cdata const &d,size_t refs = 0) : 
            calendar_facet(refs),
            data_(d)
        {
        }